

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ConditionParser.h
# Opt level: O1

void __thiscall ConditionParser::~ConditionParser(ConditionParser *this)

{
  ~ConditionParser(this);
  operator_delete(this,0x70);
  return;
}

Assistant:

~ConditionParser() override = default;